

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O3

int yescrypt_kdf(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,size_t passwdlen,
                uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,uint32_t t,uint32_t g,
                yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  uint8_t *buf_00;
  size_t buflen_00;
  ulong uVar3;
  uint8_t dk [32];
  
  if (((p != 0 && (flags & (__YESCRYPT_INIT_SHARED|YESCRYPT_RW)) == YESCRYPT_RW) && (0xff < N / p))
     && (0x1ffff < (N / p) * (ulong)r)) {
    iVar1 = yescrypt_kdf_body(shared,local,passwd,passwdlen,salt,saltlen,N >> 6,r,p,0,
                              flags | __YESCRYPT_PREHASH,dk,0x20);
    if (iVar1 != 0) {
      return -1;
    }
    passwdlen = 0x20;
    passwd = dk;
  }
  uVar3 = (ulong)t;
  iVar1 = -g;
  do {
    buf_00 = dk;
    if (iVar1 == 0) {
      buf_00 = buf;
    }
    buflen_00 = 0x20;
    if (iVar1 == 0) {
      buflen_00 = buflen;
    }
    iVar2 = yescrypt_kdf_body(shared,local,passwd,passwdlen,salt,saltlen,N,r,p,(uint32_t)uVar3,flags
                              ,buf_00,buflen_00);
    if (iVar2 != 0) {
      return -1;
    }
    N = N << 2;
    if (N == 0) {
      return -1;
    }
    uVar3 = uVar3 >> 1;
    iVar1 = iVar1 + 1;
    passwdlen = 0x20;
    passwd = dk;
  } while (iVar1 != 1);
  return 0;
}

Assistant:

int
yescrypt_kdf(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, uint32_t g,
    yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	uint8_t dk[32];

	if ((flags & (YESCRYPT_RW | __YESCRYPT_INIT_SHARED)) == YESCRYPT_RW &&
	    p >= 1 && N / p >= 0x100 && N / p * r >= 0x20000) {
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N >> 6, r, p, 0, flags | __YESCRYPT_PREHASH,
		    dk, sizeof(dk));
		if (retval)
			return retval;
		passwd = dk;
		passwdlen = sizeof(dk);
	}

	do {
		uint8_t * dkp = g ? dk : buf;
		size_t dklen = g ? sizeof(dk) : buflen;
		int retval = yescrypt_kdf_body(shared, local,
		    passwd, passwdlen, salt, saltlen,
		    N, r, p, t, flags, dkp, dklen);
		if (retval)
			return retval;

		passwd = dkp;
		passwdlen = dklen;

		N <<= 2;
		if (!N)
			return -1;
		t >>= 1;
	} while (g--);

	return 0;
}